

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
 mp::internal::
 UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
           (Expr e)

{
  bool bVar1;
  Kind k;
  char *message;
  BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> in_RDI;
  BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> *basic;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
  expr;
  AssertionFailure *in_stack_ffffffffffffffd0;
  
  k = ExprBase::kind((ExprBase *)0x180b43);
  bVar1 = Is<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
                    (k);
  if (!bVar1) {
    message = (char *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(in_stack_ffffffffffffffd0,message);
    __cxa_throw(message,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
  }
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
  ::BasicIteratedExpr((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
                       *)0x180baa);
  Unused<mp::BasicExpr<(mp::expr::Kind)47,(mp::expr::Kind)47>*>
            ((BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> **)&stack0xffffffffffffffd0);
  return (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
          )(Impl *)in_RDI.super_ExprBase.impl_;
}

Assistant:

inline ExprType internal::UncheckedCast(Expr e) {
  MP_ASSERT(Is<ExprType>(e.kind()), "invalid cast");
  ExprType expr;
  // Make sure that ExprType is a subclass or an instance of BasicExpr.
  BasicExpr<static_cast<expr::Kind>(ExprType::FIRST_KIND),
            static_cast<expr::Kind>(ExprType::LAST_KIND)> &basic = expr;
  internal::Unused(&basic);
  expr.impl_ = e.impl_;
  return expr;
}